

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int32_t zng_inflateResetKeep(zng_stream *strm)

{
  ct_data_s *pcVar1;
  internal_state *piVar2;
  int iVar3;
  int32_t iVar4;
  
  iVar3 = inflateStateCheck(strm);
  iVar4 = -2;
  if (iVar3 == 0) {
    piVar2 = strm->state;
    iVar4 = 0;
    piVar2->gzhead = (zng_gz_headerp)0x0;
    strm->total_in = 0;
    strm->total_out = 0;
    strm->msg = (char *)0x0;
    if (*(uint *)&piVar2->pending_out != 0) {
      strm->adler = *(uint *)&piVar2->pending_out & 1;
    }
    piVar2->pending_buf = (uchar *)0x3f34;
    piVar2->wrap = 1;
    piVar2->gzindex = 0;
    *(undefined8 *)((long)&piVar2->pending_out + 4) = 0xffffffff00000000;
    piVar2->status = 0;
    piVar2->last_flush = 0;
    piVar2->prev = (Pos *)0x0;
    *(undefined4 *)&piVar2->head = 0;
    pcVar1 = piVar2->dyn_ltree + 300;
    piVar2->insert_string = (insert_string_cb)pcVar1;
    *(ct_data_s **)&piVar2->match_length = pcVar1;
    *(ct_data_s **)&piVar2->ins_h = pcVar1;
    piVar2->reproducible = -1;
  }
  return iVar4;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateResetKeep)(PREFIX3(stream) *strm) {
    struct inflate_state *state;

    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state *)strm->state;
    strm->total_in = strm->total_out = state->total = 0;
    strm->msg = NULL;
    if (state->wrap)        /* to support ill-conceived Java test suite */
        strm->adler = state->wrap & 1;
    state->mode = HEAD;
    state->check = ADLER32_INITIAL_VALUE;
    state->last = 0;
    state->havedict = 0;
    state->flags = -1;
    state->head = NULL;
    state->hold = 0;
    state->bits = 0;
    state->lencode = state->distcode = state->next = state->codes;
    state->back = -1;
#ifdef INFLATE_STRICT
    state->dmax = 32768U;
#endif
#ifdef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
    state->sane = 1;
#endif
    INFLATE_RESET_KEEP_HOOK(strm);  /* hook for IBM Z DFLTCC */
    Tracev((stderr, "inflate: reset\n"));
    return Z_OK;
}